

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *name,function<void_(unsigned_long)> *function,string *description)

{
  pointer pcVar1;
  Option *pOVar2;
  IncorrectConstruction *__return_storage_ptr__;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  _Any_data local_f0;
  code *local_e0;
  _Any_data local_d0;
  long local_c0;
  undefined8 local_b8;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  std::function<void_(unsigned_long)>::function
            ((function<void_(unsigned_long)> *)&local_d0,function);
  local_108 = (code *)0x0;
  pcStack_100 = (code *)0x0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_118._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_118._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_118._M_unused._0_8_ + 0x18) = local_b8;
  if (local_c0 != 0) {
    *(undefined4 *)local_118._M_unused._0_8_ = local_d0._0_4_;
    *(undefined4 *)((long)local_118._M_unused._0_8_ + 4) = local_d0._4_4_;
    *(undefined4 *)((long)local_118._M_unused._0_8_ + 8) = local_d0._8_4_;
    *(undefined4 *)((long)local_118._M_unused._0_8_ + 0xc) = local_d0._12_4_;
    *(long *)((long)local_118._M_unused._0_8_ + 0x10) = local_c0;
  }
  pcStack_100 = std::
                _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:425:31)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:425:31)>
              ::_M_manager;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_f0,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_118);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + description->_M_string_length);
  pOVar2 = add_option(this,&local_70,(callback_t *)&local_f0,&local_90,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_e0 != (code *)0x0) {
    (*local_e0)(&local_f0,&local_f0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((pOVar2->pname_)._M_string_length == 0) {
    local_b0[0] = local_a0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"");
    ::std::__cxx11::string::_M_assign((string *)&pOVar2->typeval_);
    pOVar2->expected_ = 0;
    (pOVar2->super_OptionBase<CLI::Option>).required_ = false;
    pOVar2->changeable_ = false;
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    return pOVar2;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_50);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *add_flag_function(std::string name,
                              std::function<void(size_t)> function, ///< A function to call, void(size_t)
                              std::string description = "") {

        CLI::callback_t fun = [function](CLI::results_t res) {
            auto count = static_cast<size_t>(res.size());
            function(count);
            return true;
        };

        Option *opt = add_option(name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(name);
        opt->set_custom_option("", 0);
        return opt;
    }